

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Node * HTS_Node_find(HTS_Node *node,int num)

{
  int num_local;
  HTS_Node *node_local;
  
  node_local = node;
  while( true ) {
    if (node_local == (HTS_Node *)0x0) {
      return (HTS_Node *)0x0;
    }
    if (node_local->index == num) break;
    node_local = node_local->next;
  }
  return node_local;
}

Assistant:

static HTS_Node *HTS_Node_find(HTS_Node * node, int num)
{
   for (; node; node = node->next)
      if (node->index == num)
         return node;

   return NULL;
}